

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O0

bool isItRandom<KarpRabinHash<unsigned_int,unsigned_char>>(uint L)

{
  value_type vVar1;
  uint uVar2;
  ostream *poVar3;
  reference pvVar4;
  void *this;
  uint64 y;
  KarpRabinHash<unsigned_int,_unsigned_char> hf;
  int k_1;
  uint64 x;
  KarpRabinHash<unsigned_int,_unsigned_char> base;
  int k;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int n;
  uint L_local;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"checking that it is randomized ");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
  std::allocator<unsigned_char>::allocator(&local_31);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,5,&local_31);
  std::allocator<unsigned_char>::~allocator(&local_31);
  for (base.HASHMASK = 0;
      (int)base.HASHMASK <
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_; base.HASHMASK = base.HASHMASK + 1) {
    vVar1 = (value_type)base.HASHMASK;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                        (long)(int)base.HASHMASK);
    *pvVar4 = vVar1;
  }
  KarpRabinHash<unsigned_int,_unsigned_char>::KarpRabinHash
            ((KarpRabinHash<unsigned_int,_unsigned_char> *)((long)&x + 4),
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,L);
  uVar2 = KarpRabinHash<unsigned_int,unsigned_char>::
          hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                    ((KarpRabinHash<unsigned_int,unsigned_char> *)((long)&x + 4),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  register0x00000000 = (ulong)uVar2;
  hf.HASHMASK = 0;
  do {
    if (99 < (int)hf.HASHMASK) {
      poVar3 = std::operator<<((ostream *)&std::cout,"Not randomized! ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      n._3_1_ = false;
LAB_00103ed3:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      return n._3_1_;
    }
    KarpRabinHash<unsigned_int,_unsigned_char>::KarpRabinHash
              ((KarpRabinHash<unsigned_int,_unsigned_char> *)&y,
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_,L);
    uVar2 = KarpRabinHash<unsigned_int,unsigned_char>::
            hash<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      ((KarpRabinHash<unsigned_int,unsigned_char> *)&y,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    if (uVar2 != stack0xfffffffffffffb98) {
      poVar3 = std::operator<<((ostream *)&std::cout,"It is randomized! ");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      n._3_1_ = true;
      goto LAB_00103ed3;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"collision ");
    this = (void *)std::ostream::operator<<(poVar3,(ulong)uVar2);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    hf.HASHMASK = hf.HASHMASK + 1;
  } while( true );
}

Assistant:

bool isItRandom(uint L = 19) {
  cout << "checking that it is randomized " << endl;
  int n = 5;
  vector<unsigned char> data(n);
  for (int k = 0; k < n; ++k) {
    data[k] = static_cast<unsigned char>(k);
  }
  hashfunction base(n, L);
  uint64 x = base.hash(data);
  for (int k = 0; k < 100; ++k) {
    hashfunction hf(n, L);
    uint64 y = hf.hash(data);
    if (y != x) {
      cout << "It is randomized! " << endl;
      return true;
    }
    cout << "collision " << y << endl;
  }
  cout << "Not randomized! " << endl;
  return false; // we conclude that it always hashes to the same value (this is
                // bad)
}